

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffghps(fitsfile *fptr,int *nexist,int *position,int *status)

{
  int *status_local;
  int *position_local;
  int *nexist_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (nexist != (int *)0x0) {
      *nexist = (int)((fptr->Fptr->headend - fptr->Fptr->headstart[fptr->Fptr->curhdu]) / 0x50);
    }
    if (position != (int *)0x0) {
      *position = (int)((fptr->Fptr->nextkey - fptr->Fptr->headstart[fptr->Fptr->curhdu]) / 0x50) +
                  1;
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffghps(fitsfile *fptr, /* I - FITS file pointer                     */
          int *nexist,     /* O - number of existing keywords in header */
          int *position,   /* O - position of next keyword to be read   */
          int *status)     /* IO - error status                         */
/*
  return the number of existing keywords and the position of the next
  keyword that will be read.
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nexist)
      *nexist = (int) (( ((fptr->Fptr)->headend) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80);

    if (position)
      *position = (int) (( ((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80 + 1);

    return(*status);
}